

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int __thiscall rw::Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  FILE *__stream;
  char *pcVar1;
  uint32 __oflag;
  uint local_24;
  uint32 local_20;
  uint i;
  Error _e;
  MemoryFunctions *memfuncs_local;
  Error EVar2;
  
  _e = (Error)this;
  if ((engine == 0) && (state == 0)) {
    totalMemoryAllocated = 0;
    LinkList::init((LinkList *)&allocations,ctx);
    if (_e == (Error)0x0) {
      pcVar1 = (char *)&memfuncs;
      __oflag = 0x167770;
      memcpy(&memfuncs,defaultMemfuncs,0x28);
    }
    else {
      pcVar1 = (char *)&memfuncs;
      EVar2 = _e;
      memcpy(&memfuncs,(void *)_e,0x28);
      __oflag = EVar2.plugin;
    }
    if (DAT_00168600 == (code *)0x0) {
      DAT_00168600 = mustmalloc_h;
    }
    if (DAT_00168608 == (code *)0x0) {
      DAT_00168608 = mustrealloc_h;
    }
    PluginList::open(pcVar1,__oflag);
    for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
      PluginList::PluginList((PluginList *)(Driver::s_plglist + (ulong)local_24 * 0x18),0x58);
    }
    Frame::registerModule();
    Image::registerModule();
    Raster::registerModule();
    Texture::registerModule();
    Frame::numAllocated = 0;
    Image::numAllocated = 0;
    Raster::numAllocated = 0;
    Texture::numAllocated = 0;
    TexDictionary::numAllocated = 0;
    Geometry::numAllocated = 0;
    Material::numAllocated = 0;
    Atomic::numAllocated = 0;
    Light::numAllocated = 0;
    Camera::numAllocated = 0;
    Clump::numAllocated = 0;
    World::numAllocated = 0;
    ps2::registerPlatformPlugins();
    xbox::registerPlatformPlugins();
    d3d8::registerPlatformPlugins();
    d3d9::registerPlatformPlugins();
    wdgl::registerPlatformPlugins();
    gl3::registerPlatformPlugins();
    state = 1;
    memfuncs_local._4_4_ = 1;
  }
  else {
    local_20 = 0;
    i = 0x80000007;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp",0xbe);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000007);
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)&stack0xffffffffffffffe0);
    memfuncs_local._4_4_ = 0;
  }
  return memfuncs_local._4_4_;
}

Assistant:

bool32
Engine::init(MemoryFunctions *memfuncs)
{
	if(engine || Engine::state != Dead){
		RWERROR((ERR_ENGINEINIT));
		return 0;
	}

	totalMemoryAllocated = 0;
	allocations.init();

	if(memfuncs)
		Engine::memfuncs = *memfuncs;
	else
		Engine::memfuncs = defaultMemfuncs;

	if(Engine::memfuncs.rwmustmalloc == nil)
		Engine::memfuncs.rwmustmalloc = mustmalloc_h;
	if(Engine::memfuncs.rwmustrealloc == nil)
		Engine::memfuncs.rwmustrealloc = mustrealloc_h;

	PluginList::open();

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		new (&Driver::s_plglist[i]) PluginList(sizeof(Driver));

	// core plugin attach here
	Frame::registerModule();
	Image::registerModule();
	Raster::registerModule();
	Texture::registerModule();

	// TODO: reset all allocation counts here. or maybe do that in modules?
	Frame::numAllocated = 0;
	Image::numAllocated = 0;
	Raster::numAllocated = 0;
	Texture::numAllocated = 0;
	TexDictionary::numAllocated = 0;
	Geometry::numAllocated = 0;
	Material::numAllocated = 0;
	Atomic::numAllocated = 0;
	Light::numAllocated = 0;
	Camera::numAllocated = 0;
	Clump::numAllocated = 0;
	World::numAllocated = 0;

	// driver plugin attach
	ps2::registerPlatformPlugins();
	xbox::registerPlatformPlugins();
	d3d8::registerPlatformPlugins();
	d3d9::registerPlatformPlugins();
	wdgl::registerPlatformPlugins();
	gl3::registerPlatformPlugins();

	Engine::state = Initialized;
	return 1;
}